

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O3

void __thiscall
Model::update_gaussian_multiple_kernel
          (Model *this,vector<double,_std::allocator<double>_> *labels,int centerId,
          vector<int,_std::allocator<int>_> *contextIds,double current_lr,int numOfKernels,
          double *kernelCoefficients)

{
  size_t __n;
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  pointer piVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  uVar11 = this->dim_size;
  uVar9 = (ulong)uVar11;
  uVar13 = -(ulong)(uVar9 == 0) | uVar9 * 8;
  puVar4 = (undefined8 *)operator_new__(uVar13);
  *puVar4 = 0;
  __n = uVar13 - 8;
  memset(puVar4 + 1,0,__n);
  puVar5 = (undefined8 *)operator_new__(uVar13);
  *puVar5 = 0;
  memset(puVar5 + 1,0,__n);
  puVar6 = (undefined8 *)operator_new__(uVar13);
  *puVar6 = 0;
  memset(puVar6 + 1,0,__n);
  puVar7 = (undefined8 *)operator_new__(uVar13);
  *puVar7 = 0;
  memset(puVar7 + 1,0,__n);
  piVar8 = (contextIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar13 = (ulong)(uint)numOfKernels;
  if ((contextIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar8) {
    uVar12 = 0;
    do {
      dVar15 = 0.0;
      dVar17 = 0.0;
      if ((int)uVar9 != 0) {
        pdVar2 = this->emb1[piVar8[uVar12]];
        pdVar3 = this->emb0[centerId];
        uVar10 = 0;
        do {
          puVar7[uVar10] = pdVar2[uVar10] - pdVar3[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
        dVar17 = 0.0;
        if ((int)uVar9 != 0) {
          uVar10 = 0;
          do {
            dVar17 = dVar17 + (double)puVar7[uVar10] * (double)puVar7[uVar10];
            uVar10 = uVar10 + 1;
          } while (uVar9 != uVar10);
        }
      }
      dVar18 = 0.0;
      if (0 < numOfKernels) {
        dVar15 = 0.0;
        uVar9 = 0;
        do {
          uVar10 = uVar9 + 1;
          dVar16 = this->kernelParams[uVar9 + 1] * this->kernelParams[uVar9 + 1];
          dVar1 = kernelCoefficients[uVar9];
          dVar14 = exp(-dVar17 / (dVar16 + dVar16));
          dVar18 = dVar18 + dVar14 * dVar1;
          dVar15 = dVar15 + (1.0 / dVar16) * dVar14 * dVar1;
          uVar9 = uVar10;
        } while (uVar13 != uVar10);
        uVar9 = (ulong)this->dim_size;
      }
      uVar11 = (uint)uVar9;
      if (uVar11 == 0) {
LAB_00105f9c:
        piVar8 = (contextIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      else {
        dVar18 = (labels->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar12] - dVar18;
        uVar10 = 0;
        do {
          puVar6[uVar10] = (double)puVar7[uVar10] * dVar15 * (dVar18 + dVar18);
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
        if (uVar11 == 0) goto LAB_00105f9c;
        uVar10 = 0;
        do {
          puVar5[uVar10] = (double)puVar6[uVar10] * -current_lr;
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
        if (uVar11 == 0) goto LAB_00105f9c;
        uVar10 = 0;
        do {
          puVar4[uVar10] = (double)puVar5[uVar10] + (double)puVar4[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
        piVar8 = (contextIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (uVar11 != 0) {
          pdVar2 = this->emb1[piVar8[uVar12]];
          uVar10 = 0;
          do {
            dVar15 = pdVar2[uVar10];
            pdVar2[uVar10] = ((double)puVar5[uVar10] - this->lambda * current_lr * dVar15) + dVar15;
            uVar10 = uVar10 + 1;
          } while (uVar9 != uVar10);
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < (ulong)((long)(contextIds->super__Vector_base<int,_std::allocator<int>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)piVar8 >> 2));
  }
  if (uVar11 != 0) {
    pdVar2 = this->emb0[centerId];
    uVar9 = 0;
    do {
      dVar15 = pdVar2[uVar9];
      pdVar2[uVar9] = (-this->lambda * current_lr * dVar15 - (double)puVar4[uVar9]) + dVar15;
      uVar9 = uVar9 + 1;
    } while (uVar11 != uVar9);
  }
  operator_delete__(puVar4);
  operator_delete__(puVar5);
  operator_delete__(puVar7);
  operator_delete__(puVar6);
  uVar9 = 0xffffffffffffffff;
  if (0 < numOfKernels) {
    uVar9 = uVar13 * 8;
  }
  puVar4 = (undefined8 *)operator_new__(uVar9);
  *puVar4 = 0;
  memset(puVar4 + 1,0,uVar9 - 8);
  puVar5 = (undefined8 *)operator_new__(uVar9);
  *puVar5 = 0;
  memset(puVar5 + 1,0,uVar9 - 8);
  if ((contextIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (contextIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar9 = 0;
    do {
      if (0 < numOfKernels) {
        dVar15 = 0.0;
        uVar12 = 0;
        do {
          uVar10 = uVar12 + 1;
          dVar17 = gaussian_kernel(this,(contextIds->super__Vector_base<int,_std::allocator<int>_>).
                                        _M_impl.super__Vector_impl_data._M_start[uVar9],centerId,
                                   this->kernelParams[uVar12 + 1]);
          puVar4[uVar12] = dVar17;
          dVar15 = dVar15 + dVar17 * kernelCoefficients[uVar12];
          uVar12 = uVar10;
        } while (uVar13 != uVar10);
        if (0 < numOfKernels) {
          dVar15 = (labels->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar9] - dVar15;
          uVar12 = 0;
          do {
            puVar5[uVar12] = (double)puVar5[uVar12] - (double)puVar4[uVar12] * (dVar15 + dVar15);
            uVar12 = uVar12 + 1;
          } while (uVar13 != uVar12);
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)((long)(contextIds->super__Vector_base<int,_std::allocator<int>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(contextIds->super__Vector_base<int,_std::allocator<int>_>).
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  if (0 < numOfKernels) {
    uVar9 = 0;
    do {
      kernelCoefficients[uVar9] =
           ((double)puVar5[uVar9] * -current_lr -
           this->beta * current_lr * kernelCoefficients[uVar9]) + kernelCoefficients[uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar13 != uVar9);
  }
  operator_delete__(puVar4);
  return;
}

Assistant:

void Model::update_gaussian_multiple_kernel(vector <double> labels, int centerId, vector <int> contextIds, double current_lr, int numOfKernels, double *kernelCoefficients) {

    //for(int k=0; k<numOfKernels; k++)
    //    kernelCoefficients[k] = 1.0/numOfKernels;

    /* ----------- Update embedding vectors ----------- */
    double *neule;
    double *g, *temp_g;
    double eta, e, *diff,  *z;
    double var;
    double *e_values;

    neule = new double[this->dim_size]{0};
    g = new double[this->dim_size]{0};
    temp_g = new double[this->dim_size]{0};
    z = new double[this->dim_size]{0};
    diff = new double[this->dim_size]{0};
    e_values = new double[this->dim_size]{0};
    double e_values_sum=0;
    double e_values_sum_ext=0;
    double f;

    for(int i = 0; i < contextIds.size(); i++) {

        for (int d = 0; d < this->dim_size; d++)
            diff[d] = this->emb1[contextIds[i]][d] - this->emb0[centerId][d];

        eta = 0.0;
        for (int d = 0; d < this->dim_size; d++)
            eta += diff[d]*diff[d];

        e_values_sum = 0;
        e_values_sum_ext = 0;
        for(int k=0; k < numOfKernels; k++) {
            var = this->kernelParams[k+1] * this->kernelParams[k+1];
            e_values[k] = kernelCoefficients[k] * exp( -eta/(2.0*var) );
            e_values_sum += e_values[k];
            e_values_sum_ext += e_values[k] * ( 1.0 / var );
        }

        f = 2.0 * ( labels[i]-e_values_sum  ) * ( e_values_sum_ext );
        for (int d = 0; d < this->dim_size; d++)
            z[d] = f * ( diff[d] );

        for (int d = 0; d < this->dim_size; d++)
            g[d] = -current_lr * z[d]; // minus comes from the objective function, minimization


        for (int d = 0; d < this->dim_size; d++)
            neule[d] += g[d];

        for (int d = 0; d < this->dim_size; d++)
            this->emb1[contextIds[i]][d] += g[d] - current_lr*this->lambda*(this->emb1[contextIds[i]][d]);
    }
    for (int d = 0; d < this->dim_size; d++)
        this->emb0[centerId][d] += -neule[d] - current_lr*this->lambda*(this->emb0[centerId][d]);


    delete[] neule;
    delete [] g;
    delete [] temp_g;
    delete [] diff;
    delete [] z;
    delete [] e_values;
    /* ------------------------------------------------ */
    /* ----------- Update embedding vectors ----------- */
//    neule = new double[this->dim_size]{0};
//    g = new double[this->dim_size]{0};
//    temp_g = new double[this->dim_size]{0};
//
//
//    for(int i = 0; i < contextIds.size(); i++) {
//
//        for(int k=0; k < numOfKernels; k++) {
//
//            this->get_gaussian_grad(temp_g, labels[i], this->kernelParams[k+1], centerId, contextIds[i], current_lr);
//
//            for (int d = 0; d < this->dim_size; d++)
//                g[d] += (kernelCoefficients[k]) * temp_g[d]; // g[d] += (1.0 / numOfKernels) * temp_g[d];
//
//        }
//
//        for (int d = 0; d < this->dim_size; d++)
//            neule[d] += g[d];
//
//        for (int d = 0; d < this->dim_size; d++)
//            this->emb1[contextIds[i]][d] += g[d] - current_lr*this->lambda*(this->emb1[contextIds[i]][d]);
//    }
//    for (int d = 0; d < this->dim_size; d++)
//        this->emb0[centerId][d] += -neule[d] - current_lr*this->lambda*(this->emb0[centerId][d]);
//
//
//    delete[] neule;
//    delete [] g;
//    delete [] temp_g;
    /* ------------------------------------------------ */

    /* ---------- Update kernel coefficients ---------- */
    double kernelSum;
    double *ker, *totalKer;

    ker = new double[numOfKernels]{0};
    totalKer = new double[numOfKernels]{0};

    for(int i = 0; i < contextIds.size(); i++) {
        kernelSum = 0;
        for (int k = 0; k < numOfKernels; k++) {
            ker[k] = this->gaussian_kernel(contextIds[i], centerId, this->kernelParams[k + 1]);
            kernelSum += kernelCoefficients[k] * ker[k];
        }
        for (int k = 0; k < numOfKernels; k++)
            totalKer[k] += 2.0 * ( labels[i] - kernelSum ) * -ker[k];
    }

    for (int k = 0; k < numOfKernels; k++) {
        kernelCoefficients[k] += -current_lr * totalKer[k] - current_lr * this->beta * kernelCoefficients[k];
        //cout << kernelCoefficients[k] << " ";
    }
    //cout << endl;
    delete[] ker;
    /* ------------------------------------------------ */

}